

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.c
# Opt level: O2

void sha512_final(sha512 *ctx,uint8_t *out)

{
  size_t sVar1;
  ulong uVar2;
  long lVar3;
  
  sVar1 = ctx->fill;
  ctx->fill = sVar1 + 1;
  ctx->buffer[sVar1] = 0x80;
  uVar2 = ctx->fill;
  if (0x70 < uVar2) {
    while (uVar2 < 0x80) {
      ctx->fill = uVar2 + 1;
      ctx->buffer[uVar2] = '\0';
      uVar2 = ctx->fill;
    }
    compress(ctx->state,ctx->buffer);
    ctx->fill = 0;
    uVar2 = 0;
  }
  while (uVar2 < 0x70) {
    ctx->fill = uVar2 + 1;
    ctx->buffer[uVar2] = '\0';
    uVar2 = ctx->fill;
  }
  store_be64(ctx->buffer + 0x70,ctx->count >> 0x36);
  store_be64(ctx->buffer + 0x78,sVar1 << 3 | ctx->count << 10);
  compress(ctx->state,ctx->buffer);
  for (lVar3 = 0; lVar3 != 0x40; lVar3 = lVar3 + 8) {
    store_be64(out + lVar3,*(uint64_t *)((long)ctx->state + lVar3));
  }
  return;
}

Assistant:

void
sha512_final(struct sha512 *ctx, uint8_t out[SHA512_HASH_LENGTH])
{
	size_t rest;
	int i;

	rest = ctx->fill;
	
	/* append 1-bit to signal end of data */
	ctx->buffer[ctx->fill++] = 0x80;
	
	if (ctx->fill > SHA512_BLOCK_SIZE - 16) {
		while (ctx->fill < SHA512_BLOCK_SIZE)
			ctx->buffer[ctx->fill++] = 0;

		compress(ctx->state, ctx->buffer);
		ctx->fill = 0;
	}
	while (ctx->fill < SHA512_BLOCK_SIZE - 16)
		ctx->buffer[ctx->fill++] = 0;

	/* because rest < 128 our message length is
	 * L := 128*ctx->count + rest == (ctx->count<<7)|rest,
	 * now convert L to number of bits and write out as 128bit big-endian.
	 */
	store_be64(ctx->buffer+SHA512_BLOCK_SIZE-16,
			ctx->count >> 54);
	store_be64(ctx->buffer+SHA512_BLOCK_SIZE-8,
			((ctx->count << 7) | rest) << 3);
	
	compress(ctx->state, ctx->buffer);


	for (i = 0; i < 8; i++)
		store_be64(out + 8*i, ctx->state[i]);
}